

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent indent)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_t sVar5;
  Indent IVar6;
  char *pcVar7;
  undefined3 in_register_00000089;
  pointer pbVar8;
  const_iterator __begin2;
  string local_88;
  undefined4 local_64;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  cmInstallGenerator *local_38;
  
  local_64 = CONCAT31(in_register_00000089,optional);
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  pcVar7 = (char *)os;
  local_38 = this;
  if (type < (cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY)) {
    pcVar7 = (char *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)&local_60,0,(char *)0x0,
               (ulong)(&DAT_00493ce0 + *(int *)(&DAT_00493ce0 + (ulong)type * 4)));
  }
  IVar6.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      pcVar7 = " ";
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar6.Level = IVar6.Level + -1;
    } while (IVar6.Level != 0);
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath(dest);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n",0x2d);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    pbVar8 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_40 = files;
    if (pbVar8 != pbVar1) {
      bVar2 = true;
      do {
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(dest->_M_dataplus)._M_p,dest->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        if ((rename == (char *)0x0) || (*rename == '\0')) {
          cmsys::SystemTools::GetFilenameName(&local_88,pbVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,local_88._M_dataplus._M_p,local_88._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar5 = strlen(rename);
          std::__ostream_insert<char,std::char_traits<char>>(os,rename,sVar5);
        }
        pbVar8 = pbVar8 + 1;
        bVar2 = false;
      } while (pbVar8 != pbVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\")\n",3);
    files = local_40;
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n",0x2f);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(WARNING \"ABSOLUTE path INSTALL ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n",0x34);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n",0x30);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"DESTINATION forbidden (by caller): ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n",0x26);
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    pcVar7 = "endif()\n";
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  }
  ConvertToAbsoluteDestination(&local_88,(cmInstallGenerator *)pcVar7,dest);
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(INSTALL DESTINATION \"",0x1a);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" TYPE ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_60,local_58);
  if ((char)local_64 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," OPTIONAL",9);
  }
  uVar3 = local_38->Message - MessageAlways;
  if (uVar3 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_00493cb8 + *(int *)(&DAT_00493cb8 + (ulong)uVar3 * 4),
               *(long *)(&DAT_00493cc8 + (ulong)uVar3 * 8));
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," PERMISSIONS",0xc);
    sVar5 = strlen(permissions_file);
    std::__ostream_insert<char,std::char_traits<char>>(os,permissions_file,sVar5);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," DIR_PERMISSIONS",0x10);
    sVar5 = strlen(permissions_dir);
    std::__ostream_insert<char,std::char_traits<char>>(os,permissions_dir,sVar5);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," RENAME \"",9);
    sVar5 = strlen(rename);
    std::__ostream_insert<char,std::char_traits<char>>(os,rename,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," FILES",6);
  pbVar8 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar1 - (long)pbVar8 == 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    pbVar8 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
    pcVar7 = "\"";
  }
  else {
    for (; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    pcVar7 = " ";
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    poVar4 = os;
    if ((literal_args != (char *)0x0) && (*literal_args != '\0')) goto LAB_0019e782;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,1);
LAB_0019e782:
  if ((literal_args != (char *)0x0) && (*literal_args != '\0')) {
    sVar5 = strlen(literal_args);
    std::__ostream_insert<char,std::char_traits<char>>(os,literal_args,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void cmInstallGenerator::AddInstallRule(
  std::ostream& os, std::string const& dest, cmInstallType type,
  std::vector<std::string> const& files, bool optional /* = false */,
  const char* permissions_file /* = 0 */,
  const char* permissions_dir /* = 0 */, const char* rename /* = 0 */,
  const char* literal_args /* = 0 */, Indent indent)
{
  // Use the FILE command to install the file.
  std::string stype;
  switch (type) {
    case cmInstallType_DIRECTORY:
      stype = "DIRECTORY";
      break;
    case cmInstallType_PROGRAMS:
      stype = "PROGRAM";
      break;
    case cmInstallType_EXECUTABLE:
      stype = "EXECUTABLE";
      break;
    case cmInstallType_STATIC_LIBRARY:
      stype = "STATIC_LIBRARY";
      break;
    case cmInstallType_SHARED_LIBRARY:
      stype = "SHARED_LIBRARY";
      break;
    case cmInstallType_MODULE_LIBRARY:
      stype = "MODULE";
      break;
    case cmInstallType_FILES:
      stype = "FILE";
      break;
  }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest)) {
    os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
    os << indent << " \"";
    bool firstIteration = true;
    for (std::string const& file : files) {
      if (!firstIteration) {
        os << ";";
      }
      os << dest << "/";
      if (rename && *rename) {
        os << rename;
      } else {
        os << cmSystemTools::GetFilenameName(file);
      }
      firstIteration = false;
    }
    os << "\")\n";
    os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
       << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";

    os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
       << "DESTINATION forbidden (by caller): "
       << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";
  }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if (optional) {
    os << " OPTIONAL";
  }
  switch (this->Message) {
    case MessageDefault:
      break;
    case MessageAlways:
      os << " MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      os << " MESSAGE_LAZY";
      break;
    case MessageNever:
      os << " MESSAGE_NEVER";
      break;
  }
  if (permissions_file && *permissions_file) {
    os << " PERMISSIONS" << permissions_file;
  }
  if (permissions_dir && *permissions_dir) {
    os << " DIR_PERMISSIONS" << permissions_dir;
  }
  if (rename && *rename) {
    os << " RENAME \"" << rename << "\"";
  }
  os << " FILES";
  if (files.size() == 1) {
    os << " \"" << files[0] << "\"";
  } else {
    for (std::string const& f : files) {
      os << "\n" << indent << "  \"" << f << "\"";
    }
    os << "\n" << indent << " ";
    if (!(literal_args && *literal_args)) {
      os << " ";
    }
  }
  if (literal_args && *literal_args) {
    os << literal_args;
  }
  os << ")\n";
}